

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absPth.c
# Opt level: O3

void Gia_GlaProveAbsracted(Gia_Man_t *pGia,int fSimpProver,int fVerbose)

{
  int iVar1;
  Gia_Man_t *p;
  Aig_Man_t *pAig;
  Aig_Man_t *pAVar2;
  undefined8 *__arg;
  uint uVar3;
  int level;
  pthread_t ProverThread;
  Ssw_Pars_t Pars;
  pthread_t local_d0;
  Ssw_Pars_t local_c8;
  
  if (pGia->vGateClasses == (Vec_Int_t *)0x0) {
    __assert_fail("pGia->vGateClasses != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0x90,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  p = Gia_ManDupAbsGates(pGia,pGia->vGateClasses);
  Gia_ManCleanValue(pGia);
  pAig = Gia_ManToAigSimple(p);
  Gia_ManStop(p);
  pAVar2 = pAig;
  if (fSimpProver != 0) {
    Ssw_ManSetDefaultParams(&local_c8);
    local_c8.nFramesK = 4;
    pAVar2 = Ssw_SignalCorrespondence(pAig,&local_c8);
    Aig_ManStop(pAig);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
  if (iVar1 != 0) {
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0xa4,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  g_fAbstractionProved = 0;
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
  if (iVar1 != 0) {
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0xa6,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  __arg = (undefined8 *)calloc(1,0x10);
  *__arg = pAVar2;
  *(int *)(__arg + 1) = fVerbose;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_mutex);
  if (iVar1 == 0) {
    uVar3 = g_nRunIds + 1;
    g_nRunIds = uVar3;
    *(uint *)((long)__arg + 0xc) = uVar3;
    level = 0xe0ebf0;
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&g_mutex);
    if (iVar1 != 0) {
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                    ,0xad,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
    }
    if (fVerbose != 0) {
      Abc_Print(level,"\nTrying to prove abstraction %d.\n",(ulong)uVar3);
    }
    iVar1 = pthread_create(&local_d0,(pthread_attr_t *)0x0,Abs_ProverThread,__arg);
    if (iVar1 == 0) {
      return;
    }
    __assert_fail("status == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                  ,0xb1,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
  }
  __assert_fail("status == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absPth.c"
                ,0xab,"void Gia_GlaProveAbsracted(Gia_Man_t *, int, int)");
}

Assistant:

void Gia_GlaProveAbsracted( Gia_Man_t * pGia, int fSimpProver, int fVerbose )
{
    extern Aig_Man_t * Dar_ManRwsat( Aig_Man_t * pAig, int fBalance, int fVerbose );
    Abs_ThData_t * pThData;
    Ssw_Pars_t Pars, * pPars = &Pars;
    Aig_Man_t * pAig, * pTemp;
    Gia_Man_t * pAbs;
    pthread_t ProverThread;
    int status;
    // disable verbosity
//    fVerbose = 0;
    // create abstraction 
    assert( pGia->vGateClasses != NULL );
    pAbs = Gia_ManDupAbsGates( pGia, pGia->vGateClasses );
    Gia_ManCleanValue( pGia );
    pAig = Gia_ManToAigSimple( pAbs );
    Gia_ManStop( pAbs );
    // simplify abstraction
    if ( fSimpProver )
    {
        Ssw_ManSetDefaultParams( pPars );
        pPars->nFramesK = 4;
        pAig = Ssw_SignalCorrespondence( pTemp = pAig, pPars );
//printf( "\n" );
//Aig_ManPrintStats( pTemp );
//Aig_ManPrintStats( pAig );
        Aig_ManStop( pTemp );
    }
    // synthesize abstraction
//    pAig = Dar_ManRwsat( pTemp = pAig, 0, 0 ); 
//    Aig_ManStop( pTemp );
    // reset the proof 
    status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
    g_fAbstractionProved = 0;
    status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    // collect thread data
    pThData = ABC_CALLOC( Abs_ThData_t, 1 );
    pThData->pAig = pAig;
    pThData->fVerbose = fVerbose;
    status = pthread_mutex_lock(&g_mutex);  assert( status == 0 );
    pThData->RunId = ++g_nRunIds;
    status = pthread_mutex_unlock(&g_mutex);  assert( status == 0 );
    // create thread
    if ( fVerbose )  Abc_Print( 1, "\nTrying to prove abstraction %d.\n", pThData->RunId );
    status = pthread_create( &ProverThread, NULL, Abs_ProverThread, pThData );
    assert( status == 0 );
}